

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Builtins.h
# Opt level: O1

void __thiscall
slang::ast::builtins::Builtins::addSystemSubroutine
          (Builtins *this,shared_ptr<slang::ast::SystemSubroutine> *subroutine)

{
  size_t *psVar1;
  group_type_pointer pgVar2;
  KnownSystemName KVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  pointer psVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uchar uVar7;
  uchar uVar8;
  uchar uVar9;
  uchar uVar10;
  uchar uVar11;
  uchar uVar12;
  uchar uVar13;
  uchar uVar14;
  uchar uVar15;
  uchar uVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uchar uVar20;
  uchar uVar21;
  uchar uVar22;
  value_type *pvVar23;
  undefined8 __n;
  group_type_pointer pgVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  int iVar41;
  SystemSubroutine *__tmp;
  uint uVar42;
  ulong uVar43;
  ulong uVar44;
  long lVar45;
  group_type_pointer pgVar46;
  ulong uVar47;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  *arrays_;
  bool bVar48;
  undefined1 auVar49 [16];
  uchar uVar50;
  uchar uVar51;
  uchar uVar52;
  uchar uVar53;
  uchar uVar54;
  uchar uVar55;
  uchar uVar56;
  uchar uVar57;
  uchar uVar58;
  uchar uVar59;
  uchar uVar60;
  uchar uVar61;
  uchar uVar62;
  uchar uVar63;
  uchar uVar64;
  uchar uVar65;
  try_emplace_args_t local_d9;
  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
  *local_d8;
  Builtins *local_d0;
  __shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2> *local_c8;
  uint64_t local_c0;
  ulong local_b8;
  size_t local_b0;
  ulong local_a8;
  ulong local_a0;
  value_type *elements;
  long local_90;
  group_type_pointer local_88;
  char *local_80;
  uchar local_78;
  uchar uStack_77;
  uchar uStack_76;
  uchar uStack_75;
  uchar uStack_74;
  uchar uStack_73;
  uchar uStack_72;
  uchar uStack_71;
  uchar uStack_70;
  uchar uStack_6f;
  uchar uStack_6e;
  uchar uStack_6d;
  uchar uStack_6c;
  uchar uStack_6b;
  uchar uStack_6a;
  uchar uStack_69;
  alloc_cted_or_fwded_key_type<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_void>
  x;
  locator res;
  
  arrays_ = (table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
             *)&this->subroutineNameMap;
  peVar4 = (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  x.val.storage.t_._M_str = (peVar4->name)._M_dataplus._M_p;
  x.val.storage.t_._M_len = (peVar4->name)._M_string_length;
  local_c0 = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)arrays_
                        ,(basic_string_view<char,_std::char_traits<char>_> *)&x);
  __n = x.val.storage.t_._M_len;
  uVar44 = local_c0 >>
           ((byte)(this->subroutineNameMap).table_.
                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                  .arrays.groups_size_index & 0x3f);
  pgVar46 = (this->subroutineNameMap).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
            .arrays.groups_;
  lVar45 = (local_c0 & 0xff) * 4;
  uVar50 = (&UNK_0047fb5c)[lVar45];
  uVar51 = (&UNK_0047fb5d)[lVar45];
  uVar52 = (&UNK_0047fb5e)[lVar45];
  uVar53 = (&UNK_0047fb5f)[lVar45];
  elements = (this->subroutineNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.elements_;
  local_80 = x.val.storage.t_._M_str;
  uVar43 = (ulong)((uint)local_c0 & 7);
  local_b0 = (this->subroutineNameMap).table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
             .arrays.groups_size_mask;
  uVar47 = 0;
  uVar54 = uVar50;
  uVar55 = uVar51;
  uVar56 = uVar52;
  uVar57 = uVar53;
  uVar58 = uVar50;
  uVar59 = uVar51;
  uVar60 = uVar52;
  uVar61 = uVar53;
  uVar62 = uVar50;
  uVar63 = uVar51;
  uVar64 = uVar52;
  uVar65 = uVar53;
  local_a0 = uVar44;
  do {
    pvVar23 = elements;
    local_90 = uVar44 * 0x10;
    pgVar2 = pgVar46 + uVar44;
    auVar49[0] = -(pgVar2->m[0].n == uVar50);
    auVar49[1] = -(pgVar2->m[1].n == uVar51);
    auVar49[2] = -(pgVar2->m[2].n == uVar52);
    auVar49[3] = -(pgVar2->m[3].n == uVar53);
    auVar49[4] = -(pgVar2->m[4].n == uVar54);
    auVar49[5] = -(pgVar2->m[5].n == uVar55);
    auVar49[6] = -(pgVar2->m[6].n == uVar56);
    auVar49[7] = -(pgVar2->m[7].n == uVar57);
    auVar49[8] = -(pgVar2->m[8].n == uVar58);
    auVar49[9] = -(pgVar2->m[9].n == uVar59);
    auVar49[10] = -(pgVar2->m[10].n == uVar60);
    auVar49[0xb] = -(pgVar2->m[0xb].n == uVar61);
    auVar49[0xc] = -(pgVar2->m[0xc].n == uVar62);
    auVar49[0xd] = -(pgVar2->m[0xd].n == uVar63);
    auVar49[0xe] = -(pgVar2->m[0xe].n == uVar64);
    auVar49[0xf] = -(pgVar2->m[0xf].n == uVar65);
    local_a8 = uVar44;
    pgVar24 = pgVar46;
    uVar25 = uVar50;
    uVar26 = uVar51;
    uVar27 = uVar52;
    uVar28 = uVar53;
    uVar29 = uVar54;
    uVar30 = uVar55;
    uVar31 = uVar56;
    uVar32 = uVar57;
    uVar33 = uVar58;
    uVar34 = uVar59;
    uVar35 = uVar60;
    uVar36 = uVar61;
    uVar37 = uVar62;
    uVar38 = uVar63;
    uVar39 = uVar64;
    uVar40 = uVar65;
    pgVar2 = local_88;
    uVar7 = local_78;
    uVar8 = uStack_77;
    uVar9 = uStack_76;
    uVar10 = uStack_75;
    uVar11 = uStack_74;
    uVar12 = uStack_73;
    uVar13 = uStack_72;
    uVar14 = uStack_71;
    uVar15 = uStack_70;
    uVar16 = uStack_6f;
    uVar17 = uStack_6e;
    uVar18 = uStack_6d;
    uVar19 = uStack_6c;
    uVar20 = uStack_6b;
    uVar21 = uStack_6a;
    uVar22 = uStack_69;
    for (uVar42 = (uint)(ushort)((ushort)(SUB161(auVar49 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar49 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar49 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar49 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar49 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar49 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar49 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar49 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar49 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar49 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar49 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar49 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar49 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar49 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar49 >> 0x77,0) & 1) << 0xe); uStack_69 = uVar40,
        uStack_6a = uVar39, uStack_6b = uVar38, uStack_6c = uVar37, uStack_6d = uVar36,
        uStack_6e = uVar35, uStack_6f = uVar34, uStack_70 = uVar33, uStack_71 = uVar32,
        uStack_72 = uVar31, uStack_73 = uVar30, uStack_74 = uVar29, uStack_75 = uVar28,
        uStack_76 = uVar27, uStack_77 = uVar26, local_78 = uVar25, local_88 = pgVar24, uVar42 != 0;
        uVar42 = uVar42 - 1 & uVar42) {
      iVar41 = 0;
      if (uVar42 != 0) {
        for (; (uVar42 >> iVar41 & 1) == 0; iVar41 = iVar41 + 1) {
        }
      }
      bVar48 = __n == *(size_t *)
                       ((long)&pvVar23[uVar44 * 0xf].first._M_len + (ulong)(uint)(iVar41 << 5));
      lVar45 = (long)&pvVar23[uVar44 * 0xf].first._M_len + (ulong)(uint)(iVar41 << 5);
      local_d8 = arrays_;
      local_d0 = this;
      local_c8 = &subroutine->
                  super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>;
      local_b8 = uVar43;
      if (bVar48 && __n != 0) {
        iVar41 = bcmp(local_80,*(void **)(lVar45 + 8),__n);
        bVar48 = iVar41 == 0;
        pgVar46 = local_88;
        uVar50 = local_78;
        uVar51 = uStack_77;
        uVar52 = uStack_76;
        uVar53 = uStack_75;
        uVar54 = uStack_74;
        uVar55 = uStack_73;
        uVar56 = uStack_72;
        uVar57 = uStack_71;
        uVar58 = uStack_70;
        uVar59 = uStack_6f;
        uVar60 = uStack_6e;
        uVar61 = uStack_6d;
        uVar62 = uStack_6c;
        uVar63 = uStack_6b;
        uVar64 = uStack_6a;
        uVar65 = uStack_69;
      }
      subroutine = (shared_ptr<slang::ast::SystemSubroutine> *)local_c8;
      arrays_ = local_d8;
      this = local_d0;
      if (bVar48) goto LAB_0014f4a8;
      uVar43 = local_b8;
      pgVar24 = local_88;
      uVar25 = local_78;
      uVar26 = uStack_77;
      uVar27 = uStack_76;
      uVar28 = uStack_75;
      uVar29 = uStack_74;
      uVar30 = uStack_73;
      uVar31 = uStack_72;
      uVar32 = uStack_71;
      uVar33 = uStack_70;
      uVar34 = uStack_6f;
      uVar35 = uStack_6e;
      uVar36 = uStack_6d;
      uVar37 = uStack_6c;
      uVar38 = uStack_6b;
      uVar39 = uStack_6a;
      uVar40 = uStack_69;
      pgVar2 = local_88;
      uVar7 = local_78;
      uVar8 = uStack_77;
      uVar9 = uStack_76;
      uVar10 = uStack_75;
      uVar11 = uStack_74;
      uVar12 = uStack_73;
      uVar13 = uStack_72;
      uVar14 = uStack_71;
      uVar15 = uStack_70;
      uVar16 = uStack_6f;
      uVar17 = uStack_6e;
      uVar18 = uStack_6d;
      uVar19 = uStack_6c;
      uVar20 = uStack_6b;
      uVar21 = uStack_6a;
      uVar22 = uStack_69;
    }
    local_88 = pgVar2;
    local_78 = uVar7;
    uStack_77 = uVar8;
    uStack_76 = uVar9;
    uStack_75 = uVar10;
    uStack_74 = uVar11;
    uStack_73 = uVar12;
    uStack_72 = uVar13;
    uStack_71 = uVar14;
    uStack_70 = uVar15;
    uStack_6f = uVar16;
    uStack_6e = uVar17;
    uStack_6d = uVar18;
    uStack_6c = uVar19;
    uStack_6b = uVar20;
    uStack_6a = uVar21;
    uStack_69 = uVar22;
    if ((((slot_type *)((long)pgVar46 + 0xf))[local_90].n &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar43]) == 0) break;
    lVar45 = local_a8 + uVar47;
    uVar47 = uVar47 + 1;
    uVar44 = lVar45 + 1U & local_b0;
  } while (uVar47 <= local_b0);
  lVar45 = 0;
LAB_0014f4a8:
  if (lVar45 == 0) {
    if ((this->subroutineNameMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
        .size_ctrl.size <
        (this->subroutineNameMap).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>&>
                (&res,arrays_,(arrays_type *)arrays_,local_a0,local_c0,&local_d9,
                 (basic_string_view<char,_std::char_traits<char>_> *)&x,subroutine);
      psVar1 = &(this->subroutineNameMap).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_std::shared_ptr<slang::ast::SystemSubroutine>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::shared_ptr<slang::ast::SystemSubroutine>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>,std::shared_ptr<slang::ast::SystemSubroutine>&>
                (&res,arrays_,local_c0,&local_d9,
                 (basic_string_view<char,_std::char_traits<char>_> *)&x,subroutine);
    }
  }
  peVar4 = (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  p_Var5 = (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>
           )._M_refcount._M_pi;
  KVar3 = peVar4->knownNameId;
  psVar6 = (this->systemSubroutines).
           super__Vector_base<std::shared_ptr<slang::ast::SystemSubroutine>,_std::allocator<std::shared_ptr<slang::ast::SystemSubroutine>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
       = (element_type *)0x0;
  (subroutine->super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  psVar6[(int)KVar3].super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = peVar4;
  this_00 = psVar6[(int)KVar3].
            super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi;
  psVar6[(int)KVar3].super___shared_ptr<slang::ast::SystemSubroutine,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var5;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return;
}

Assistant:

void addSystemSubroutine(std::shared_ptr<SystemSubroutine> subroutine) {
        SLANG_ASSERT(subroutine->knownNameId != KnownSystemName::Unknown);
        SLANG_ASSERT(!systemSubroutines[(size_t)subroutine->knownNameId]);
        subroutineNameMap.emplace(subroutine->name, subroutine);
        systemSubroutines[(size_t)subroutine->knownNameId] = std::move(subroutine);
    }